

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O3

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  void *pvVar1;
  int iVar2;
  int *__ptr;
  long lVar3;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr = (int *)S->content;
    if (__ptr != (int *)0x0) {
      if (*(long *)(__ptr + 0x20) != 0) {
        N_VDestroy(*(long *)(__ptr + 0x20));
        __ptr = (int *)S->content;
        __ptr[0x20] = 0;
        __ptr[0x21] = 0;
      }
      if (*(long *)(__ptr + 0x24) != 0) {
        N_VDestroy(*(long *)(__ptr + 0x24));
        __ptr = (int *)S->content;
        __ptr[0x24] = 0;
        __ptr[0x25] = 0;
      }
      if (*(long *)(__ptr + 0x18) != 0) {
        N_VDestroyVectorArray(*(long *)(__ptr + 0x18),*__ptr + 1);
        __ptr = (int *)S->content;
        __ptr[0x18] = 0;
        __ptr[0x19] = 0;
      }
      if (*(long *)(__ptr + 0x1a) != 0) {
        N_VDestroyVectorArray(*(long *)(__ptr + 0x1a),*__ptr + 1);
        __ptr = (int *)S->content;
        __ptr[0x1a] = 0;
        __ptr[0x1b] = 0;
      }
      pvVar1 = *(void **)(__ptr + 0x1c);
      if (pvVar1 != (void *)0x0) {
        iVar2 = *__ptr;
        if (-1 < iVar2) {
          lVar3 = -1;
          do {
            pvVar1 = *(void **)(*(long *)(__ptr + 0x1c) + 8 + lVar3 * 8);
            if (pvVar1 != (void *)0x0) {
              free(pvVar1);
              *(undefined8 *)(*(long *)((long)S->content + 0x70) + 8 + lVar3 * 8) = 0;
              __ptr = (int *)S->content;
              iVar2 = *__ptr;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < iVar2);
          pvVar1 = *(void **)(__ptr + 0x1c);
        }
        free(pvVar1);
        __ptr = (int *)S->content;
        __ptr[0x1c] = 0;
        __ptr[0x1d] = 0;
      }
      if (*(void **)(__ptr + 0x1e) != (void *)0x0) {
        free(*(void **)(__ptr + 0x1e));
        __ptr = (int *)S->content;
        __ptr[0x1e] = 0;
        __ptr[0x1f] = 0;
      }
      if (*(void **)(__ptr + 0x22) != (void *)0x0) {
        free(*(void **)(__ptr + 0x22));
        __ptr = (int *)S->content;
        __ptr[0x22] = 0;
        __ptr[0x23] = 0;
      }
      if (*(void **)(__ptr + 0x26) != (void *)0x0) {
        free(*(void **)(__ptr + 0x26));
        __ptr = (int *)S->content;
        __ptr[0x26] = 0;
        __ptr[0x27] = 0;
      }
      if (*(void **)(__ptr + 0x28) != (void *)0x0) {
        free(*(void **)(__ptr + 0x28));
        __ptr = (int *)S->content;
        __ptr[0x28] = 0;
        __ptr[0x29] = 0;
      }
      free(__ptr);
      S->content = (void *)0x0;
    }
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
    }
    free(S);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) { return SUN_SUCCESS; }

  if (S->content)
  {
    /* delete items from within the content structure */
    if (SPFGMR_CONTENT(S)->xcor)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->xcor);
      SPFGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPFGMR_CONTENT(S)->vtemp)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
      SPFGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPFGMR_CONTENT(S)->V)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->V = NULL;
    }
    if (SPFGMR_CONTENT(S)->Z)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->Z = NULL;
    }
    if (SPFGMR_CONTENT(S)->Hes)
    {
      for (k = 0; k <= SPFGMR_CONTENT(S)->maxl; k++)
      {
        if (SPFGMR_CONTENT(S)->Hes[k])
        {
          free(SPFGMR_CONTENT(S)->Hes[k]);
          SPFGMR_CONTENT(S)->Hes[k] = NULL;
        }
      }
      free(SPFGMR_CONTENT(S)->Hes);
      SPFGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPFGMR_CONTENT(S)->givens)
    {
      free(SPFGMR_CONTENT(S)->givens);
      SPFGMR_CONTENT(S)->givens = NULL;
    }
    if (SPFGMR_CONTENT(S)->yg)
    {
      free(SPFGMR_CONTENT(S)->yg);
      SPFGMR_CONTENT(S)->yg = NULL;
    }
    if (SPFGMR_CONTENT(S)->cv)
    {
      free(SPFGMR_CONTENT(S)->cv);
      SPFGMR_CONTENT(S)->cv = NULL;
    }
    if (SPFGMR_CONTENT(S)->Xv)
    {
      free(SPFGMR_CONTENT(S)->Xv);
      SPFGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}